

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog.c
# Opt level: O1

wchar_t curses_msgwin(char *msg)

{
  undefined4 uVar1;
  int iVar2;
  wchar_t wVar3;
  size_t sVar4;
  WINDOW *win;
  ushort **ppuVar5;
  byte *pbVar6;
  int iVar7;
  
  sVar4 = strlen(msg);
  uVar1 = curs_set(0);
  win = newdialog(L'\x03',(int)sVar4 + L'\x04');
  sVar4 = strlen(msg);
  ppuVar5 = __ctype_b_loc();
  iVar7 = (int)sVar4 + 1;
  pbVar6 = (byte *)(msg + (int)sVar4);
  do {
    pbVar6 = pbVar6 + -1;
    iVar7 = iVar7 + -1;
  } while ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar6 * 2 + 1) & 0x20) != 0);
  iVar2 = wmove(win,1,2);
  if (iVar2 != -1) {
    waddnstr(win,msg,iVar7);
  }
  wrefresh(win);
  wVar3 = nh_wgetch(win);
  delwin(win);
  curs_set(uVar1);
  redraw_game_windows();
  return wVar3;
}

Assistant:

int curses_msgwin(const char *msg)
{
    int key, len;
    int width = strlen(msg) + 4;
    int prevcurs = curs_set(0);
    WINDOW *win = newdialog(3, width);
    
    len = strlen(msg);
    while (isspace((unsigned char)msg[len-1]))
	len--;
    
    mvwaddnstr(win, 1, 2, msg, len);
    wrefresh(win);
    key = nh_wgetch(win); /* wait for any key */
    
    delwin(win);
    curs_set(prevcurs);
    redraw_game_windows();
    
    return key;
}